

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.h
# Opt level: O2

string_view __thiscall
absl::lts_20250127::StripLeadingAsciiWhitespace(lts_20250127 *this,string_view str)

{
  char *pcVar1;
  char *pcVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  string_view sVar4;
  string_view str_local;
  
  pcVar2 = (char *)str._M_len;
  str_local._M_len = (size_t)this;
  str_local._M_str = pcVar2;
  pcVar1 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_negate<bool(*)(unsigned_char)>>
                     (pcVar2,pcVar2 + (long)this,ascii_isspace);
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    (&str_local,(long)pcVar1 - (long)pcVar2,0xffffffffffffffff);
  sVar4._M_len = bVar3._M_len;
  sVar4._M_str = bVar3._M_str;
  return sVar4;
}

Assistant:

ABSL_MUST_USE_RESULT inline absl::string_view StripLeadingAsciiWhitespace(
    absl::string_view str) {
  auto it = std::find_if_not(str.begin(), str.end(), absl::ascii_isspace);
  return str.substr(static_cast<size_t>(it - str.begin()));
}